

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::Impl::StdString::CasedString::adjustString
          (string *__return_storage_ptr__,CasedString *this,string *str)

{
  if (this->m_caseSensitivity == No) {
    toLower(__return_storage_ptr__,str);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string adjustString( std::string const& str ) const {
                return m_caseSensitivity == CaseSensitive::No
                    ? toLower( str )
                    : str;

            }